

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

_Bool handled_read_error(cio_websocket *websocket,cio_error err)

{
  char *reason;
  cio_websocket_status_code status_code;
  cio_error err_00;
  
  if (err != CIO_SUCCESS) {
    if (err == CIO_EOF) {
      reason = "connection closed by other peer";
      status_code = CIO_WEBSOCKET_CLOSE_NORMAL;
      err_00 = CIO_EOF;
    }
    else {
      reason = "error while reading websocket packet";
      status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
      err_00 = err;
    }
    handle_error(websocket,err_00,status_code,reason);
  }
  return err != CIO_SUCCESS;
}

Assistant:

static inline bool handled_read_error(struct cio_websocket *websocket, enum cio_error err)
{
	if (cio_unlikely(err != CIO_SUCCESS)) {
		if (err == CIO_EOF) {
			handle_error(websocket, CIO_EOF, CIO_WEBSOCKET_CLOSE_NORMAL, "connection closed by other peer");
		} else {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while reading websocket packet");
		}

		return true;
	}

	return false;
}